

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAnimation2Node(XMLLoader *this,Ref<embree::XML> *xml)

{
  Node *pNVar1;
  runtime_error *this_00;
  long *plVar2;
  size_type *psVar3;
  long *in_RDX;
  Ref<embree::SceneGraph::Node> node1;
  Ref<embree::SceneGraph::Node> local_78;
  Ref<embree::SceneGraph::Node> local_70;
  Ref<embree::SceneGraph::Node> local_68;
  undefined1 local_60 [64];
  
  if (*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) == 0x10) {
    loadNode(this,xml);
    loadNode((XMLLoader *)local_60,xml);
    pNVar1 = (Node *)(this->path).filename._M_dataplus._M_p;
    local_68.ptr = pNVar1;
    if (pNVar1 != (Node *)0x0) {
      (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
    }
    local_70.ptr = (Node *)local_60._0_8_;
    if ((long *)local_60._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_60._0_8_ + 0x10))(local_60._0_8_);
    }
    SceneGraph::extend_animation(&local_68,&local_70);
    if (local_70.ptr != (Node *)0x0) {
      (*((local_70.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    if (local_68.ptr != (Node *)0x0) {
      (*((local_68.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    local_78.ptr = pNVar1;
    if (pNVar1 != (Node *)0x0) {
      (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
    }
    SceneGraph::optimize_animation(&local_78);
    if (local_78.ptr != (Node *)0x0) {
      (*((local_78.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    if ((long *)local_60._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_60._0_8_ + 0x18))(local_60._0_8_);
    }
    return (Ref<embree::SceneGraph::Node>)(Node *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_((string *)(local_60 + 0x20),(ParseLocation *)(*in_RDX + 0x10));
  plVar2 = (long *)std::__cxx11::string::append(local_60 + 0x20);
  local_60._0_8_ = *plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_60._0_8_ == psVar3) {
    local_60._16_8_ = *psVar3;
    local_60._24_8_ = plVar2[3];
    local_60._0_8_ = local_60 + 0x10;
  }
  else {
    local_60._16_8_ = *psVar3;
  }
  local_60._8_8_ = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)local_60);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAnimation2Node(const Ref<XML>& xml) 
  {
    if (xml->size() != 2) THROW_RUNTIME_ERROR(xml->loc.str()+": invalid Animation2 node");
    Ref<SceneGraph::Node> node0 = loadNode(xml->children[0]);
    Ref<SceneGraph::Node> node1 = loadNode(xml->children[1]);
    SceneGraph::extend_animation(node0,node1);
    SceneGraph::optimize_animation(node0);
    return node0;
  }